

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfo.cpp
# Opt level: O3

uint8_t GmmGetCompressionFormat(GMM_RESOURCE_FORMAT Format,GMM_LIB_CONTEXT *pGmmLibContext)

{
  uint8_t uVar1;
  
  uVar1 = '\r';
  if (Format - GMM_FORMAT_A1B5G5R5_UNORM < 0x180) {
    uVar1 = (pGmmLibContext->pPlatformInfo->Data).FormatTable[Format].CompressionFormat.
            CompressionFormat;
  }
  return uVar1;
}

Assistant:

uint8_t GMM_STDCALL GmmGetCompressionFormat(GMM_RESOURCE_FORMAT Format, GMM_LIB_CONTEXT *pGmmLibContext)
{
    return (((Format > GMM_FORMAT_INVALID) &&
             (Format < GMM_RESOURCE_FORMATS)) ?
            pGmmLibContext->GetPlatformInfo().FormatTable[Format].CompressionFormat.CompressionFormat :
            GMM_UNIFIED_CMF_INVALID);
}